

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

WindowBoundsSet * duckdb::WindowBoundariesState::GetWindowBounds(BoundWindowExpression *wexpr)

{
  ExpressionType EVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  BoundWindowExpression *in_RSI;
  WindowBoundsSet *in_RDI;
  pair<std::__detail::_Node_iterator<duckdb::WindowBounds,_true,_true>,_bool> pVar5;
  size_type order_count;
  size_type partition_count;
  WindowBoundsSet *result;
  key_type *in_stack_fffffffffffff5c8;
  undefined7 in_stack_fffffffffffff5d0;
  undefined1 in_stack_fffffffffffff5d7;
  value_type *in_stack_fffffffffffff5d8;
  undefined7 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff630;
  string *in_stack_fffffffffffff638;
  undefined7 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff647;
  ExpressionType in_stack_fffffffffffff86f;
  allocator local_351;
  string local_350 [32];
  _Node_iterator_base<duckdb::WindowBounds,_true> local_330;
  undefined1 local_328;
  undefined1 local_319;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_318;
  undefined1 local_310;
  undefined1 local_301;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_300;
  undefined1 local_2f8;
  undefined1 local_2e9;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_2e8;
  undefined1 local_2e0;
  undefined1 local_2d1;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_2d0;
  undefined1 local_2c8;
  undefined1 local_2b9;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_2b8;
  undefined1 local_2b0;
  undefined1 local_2a1;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_2a0;
  undefined1 local_298;
  undefined1 local_289;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_288;
  undefined1 local_280;
  undefined1 local_271;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_270;
  undefined1 local_268;
  undefined1 local_259;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_258;
  undefined1 local_250;
  undefined1 local_241;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_240;
  undefined1 local_238;
  undefined1 local_229;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_228;
  undefined1 local_220;
  undefined1 local_211;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_210;
  undefined1 local_208;
  undefined1 local_1f9;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_1f8;
  undefined1 local_1f0;
  undefined1 local_1e1;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_1e0;
  undefined1 local_1d8;
  undefined1 local_1c9;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_1c8;
  undefined1 local_1c0;
  undefined1 local_1b1;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_1b0;
  undefined1 local_1a8;
  undefined1 local_199;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_198;
  undefined1 local_190;
  undefined1 local_181;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_180;
  undefined1 local_178;
  undefined1 local_169;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_168;
  undefined1 local_160;
  undefined1 local_151;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_150;
  undefined1 local_148;
  undefined1 local_139;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_138;
  undefined1 local_130;
  undefined1 local_121;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_120;
  undefined1 local_118;
  undefined1 local_109;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_108;
  undefined1 local_100;
  undefined1 local_f1;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_f0;
  undefined1 local_e8;
  undefined1 local_d9;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_d8;
  undefined1 local_d0;
  undefined1 local_c1;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_c0;
  undefined1 local_b8;
  undefined1 local_a9;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_a8;
  undefined1 local_a0;
  undefined1 local_91;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_90;
  undefined1 local_88;
  undefined1 local_79;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_78;
  undefined1 local_70;
  undefined1 local_61;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_60;
  undefined1 local_58;
  undefined1 local_49;
  _Node_iterator_base<duckdb::WindowBounds,_true> local_48;
  undefined1 local_40;
  undefined1 local_35;
  undefined1 local_21;
  size_type local_20;
  size_type local_18;
  BoundWindowExpression *local_10;
  
  local_10 = in_RSI;
  local_18 = ::std::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)&in_RSI->partitions);
  local_20 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
             size(&(local_10->orders).
                   super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 );
  local_21 = 0;
  ::std::
  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
  ::unordered_set((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                   *)0x1a310a4);
  EVar1 = BaseExpression::GetExpressionType((BaseExpression *)local_10);
  if (1 < (byte)(EVar1 + 0x7e)) {
    if ((byte)(EVar1 + WINDOW_CUME_DIST) < 2) {
      bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
              empty((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                    CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
      if (bVar2) {
        local_2a1 = 0;
        pVar5 = ::std::
                unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8);
        local_2b8._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur
        ;
        local_2b0 = pVar5.second;
        local_2b9 = 1;
        pVar5 = ::std::
                unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8);
        local_2d0._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur
        ;
        local_2c8 = pVar5.second;
      }
      else {
        local_2d1 = 6;
        pVar5 = ::std::
                unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8);
        local_2e8._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur
        ;
        local_2e0 = pVar5.second;
        local_2e9 = 7;
        pVar5 = ::std::
                unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8);
        local_300._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur
        ;
        local_2f8 = pVar5.second;
      }
      goto LAB_01a31d39;
    }
    if ((EVar1 != WINDOW_NTH_VALUE) && (EVar1 != WINDOW_AGGREGATE)) {
      if (EVar1 == WINDOW_RANK) {
        bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                empty((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
        if (bVar2) {
          local_d9 = 0;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_f0._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_e8 = pVar5.second;
          local_f1 = 2;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_108._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_100 = pVar5.second;
        }
        else {
          local_109 = 6;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_120._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_118 = pVar5.second;
          local_121 = 7;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_138._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_130 = pVar5.second;
          local_139 = 2;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_150._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_148 = pVar5.second;
        }
      }
      else if (EVar1 == WINDOW_RANK_DENSE) {
        local_151 = 0;
        pVar5 = ::std::
                unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8);
        local_168._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur
        ;
        local_160 = pVar5.second;
        local_169 = 2;
        pVar5 = ::std::
                unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8);
        local_180._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur
        ;
        local_178 = pVar5.second;
      }
      else if (EVar1 == WINDOW_NTILE) {
        bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                empty((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
        if (bVar2) {
          local_79 = 0;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_90._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_88 = pVar5.second;
          local_91 = 1;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_a8._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_a0 = pVar5.second;
        }
        else {
          local_a9 = 6;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_c0._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_b8 = pVar5.second;
          local_c1 = 7;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_d8._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_d0 = pVar5.second;
        }
      }
      else if (EVar1 == WINDOW_PERCENT_RANK) {
        bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                empty((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
        if (bVar2) {
          local_181 = 0;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_198._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_190 = pVar5.second;
          local_199 = 1;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_1b0._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_1a8 = pVar5.second;
          local_1b1 = 2;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_1c8._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_1c0 = pVar5.second;
        }
        else {
          local_1c9 = 6;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_1e0._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_1d8 = pVar5.second;
          local_1e1 = 7;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_1f8._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_1f0 = pVar5.second;
          local_1f9 = 2;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_210._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_208 = pVar5.second;
        }
      }
      else if (EVar1 == WINDOW_CUME_DIST) {
        bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                empty((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
        if (bVar2) {
          local_211 = 0;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_228._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_220 = pVar5.second;
          local_229 = 1;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_240._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_238 = pVar5.second;
          local_241 = 3;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_258._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_250 = pVar5.second;
        }
        else {
          local_259 = 6;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_270._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_268 = pVar5.second;
          local_271 = 7;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_288._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_280 = pVar5.second;
          local_289 = 3;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_2a0._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_298 = pVar5.second;
        }
      }
      else {
        if (EVar1 != WINDOW_ROW_NUMBER) {
          uVar3 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_350,"Window expression type %s",&local_351);
          BaseExpression::GetExpressionType((BaseExpression *)local_10);
          ExpressionTypeToString_abi_cxx11_(in_stack_fffffffffffff86f);
          InternalException::InternalException<std::__cxx11::string>
                    ((InternalException *)
                     CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
                     in_stack_fffffffffffff638,in_stack_fffffffffffff630);
          __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
        }
        bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                empty((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
        if (bVar2) {
          local_35 = 0;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_48._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_40 = pVar5.second;
        }
        else {
          local_49 = 6;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_60._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_58 = pVar5.second;
          local_61 = 7;
          pVar5 = ::std::
                  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                  ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                            *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                           in_stack_fffffffffffff5d8);
          local_78._M_cur =
               (__node_type *)
               pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
          local_70 = pVar5.second;
        }
      }
      goto LAB_01a31d39;
    }
  }
  local_301 = 6;
  pVar5 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                    *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                   in_stack_fffffffffffff5d8);
  local_318._M_cur =
       (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
  local_310 = pVar5.second;
  local_319 = 7;
  pVar5 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                    *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                   in_stack_fffffffffffff5d8);
  local_330._M_cur =
       (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::WindowBounds,_true>._M_cur;
  local_328 = pVar5.second;
LAB_01a31d39:
  sVar4 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                   *)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                  in_stack_fffffffffffff5c8);
  bVar2 = true;
  if (sVar4 == 0) {
    sVar4 = ::std::
            unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
            ::count((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                     *)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                    in_stack_fffffffffffff5c8);
    bVar2 = sVar4 != 0;
  }
  if (bVar2) {
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8);
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8);
    if (local_10->exclude_clause != NO_OTHER) {
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
    }
    switch(local_10->start) {
    case INVALID:
    case UNBOUNDED_PRECEDING:
    case UNBOUNDED_FOLLOWING:
    case CURRENT_ROW_ROWS:
    case EXPR_PRECEDING_ROWS:
    case EXPR_FOLLOWING_ROWS:
      break;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_PRECEDING_RANGE:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_FOLLOWING_RANGE:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_PRECEDING_GROUPS:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_FOLLOWING_GROUPS:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
    }
    switch(local_10->end) {
    case INVALID:
    case UNBOUNDED_PRECEDING:
    case UNBOUNDED_FOLLOWING:
    case CURRENT_ROW_ROWS:
    case EXPR_PRECEDING_ROWS:
    case EXPR_FOLLOWING_ROWS:
      break;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_PRECEDING_RANGE:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_FOLLOWING_RANGE:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_PRECEDING_GROUPS:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
      break;
    case EXPR_FOLLOWING_GROUPS:
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
    }
  }
  sVar4 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                   *)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                  in_stack_fffffffffffff5c8);
  if (sVar4 != 0) {
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8);
    bVar2 = HasFollowingRange(local_10);
    if (bVar2) {
      ::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
    }
  }
  sVar4 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                   *)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                  in_stack_fffffffffffff5c8);
  if (sVar4 != 0) {
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8);
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8);
  }
  sVar4 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                   *)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                  in_stack_fffffffffffff5c8);
  if ((sVar4 != 0) &&
     (::std::
      unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
      ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8), local_20 != 0)) {
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
             in_stack_fffffffffffff5d8);
  }
  sVar4 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
                   *)CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0),
                  in_stack_fffffffffffff5c8);
  bVar2 = sVar4 != 0 && local_18 + local_20 != 0;
  if (bVar2) {
    ::std::
    unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
    ::insert((unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
              *)CONCAT17(bVar2,in_stack_fffffffffffff5e0),in_stack_fffffffffffff5d8);
  }
  return in_RDI;
}

Assistant:

WindowBoundsSet WindowBoundariesState::GetWindowBounds(const BoundWindowExpression &wexpr) {
	const auto partition_count = wexpr.partitions.size();
	const auto order_count = wexpr.orders.size();

	WindowBoundsSet result;
	switch (wexpr.GetExpressionType()) {
	case ExpressionType::WINDOW_ROW_NUMBER:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
		}
		break;
	case ExpressionType::WINDOW_NTILE:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
		}
		break;
	case ExpressionType::WINDOW_RANK:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PEER_BEGIN);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
			result.insert(PEER_BEGIN);
		}
		break;
	case ExpressionType::WINDOW_RANK_DENSE:
		result.insert(PARTITION_BEGIN);
		result.insert(PEER_BEGIN);
		break;
	case ExpressionType::WINDOW_PERCENT_RANK:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
			result.insert(PEER_BEGIN);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
			result.insert(PEER_BEGIN);
		}
		break;
	case ExpressionType::WINDOW_CUME_DIST:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
			result.insert(PEER_END);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
			result.insert(PEER_END);
		}
		break;
	case ExpressionType::WINDOW_LEAD:
	case ExpressionType::WINDOW_LAG:
		if (wexpr.arg_orders.empty()) {
			result.insert(PARTITION_BEGIN);
			result.insert(PARTITION_END);
		} else {
			// Secondary orders need to know where the frame is
			result.insert(FRAME_BEGIN);
			result.insert(FRAME_END);
		}
		break;
	case ExpressionType::WINDOW_FIRST_VALUE:
	case ExpressionType::WINDOW_LAST_VALUE:
	case ExpressionType::WINDOW_NTH_VALUE:
	case ExpressionType::WINDOW_AGGREGATE:
		result.insert(FRAME_BEGIN);
		result.insert(FRAME_END);
		break;
	default:
		throw InternalException("Window expression type %s", ExpressionTypeToString(wexpr.GetExpressionType()));
	}

	//	Internal dependencies
	if (result.count(FRAME_BEGIN) || result.count(FRAME_END)) {
		result.insert(PARTITION_BEGIN);
		result.insert(PARTITION_END);

		// if we have EXCLUDE GROUP / TIES, we also need peer boundaries
		if (wexpr.exclude_clause != WindowExcludeMode::NO_OTHER) {
			result.insert(PEER_BEGIN);
			result.insert(PEER_END);
		}

		// If the frames are RANGE or GROUPS, then we need peer boundaries
		// If they are preceding or following, RANGE also needs to know
		// where the valid values begin or end.
		switch (wexpr.start) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			result.insert(PEER_BEGIN);
			break;
		case WindowBoundary::EXPR_PRECEDING_RANGE:
			result.insert(PEER_BEGIN);
			result.insert(VALID_BEGIN);
			result.insert(VALID_END);
			break;
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
			result.insert(PEER_BEGIN);
			result.insert(VALID_END);
			break;
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			result.insert(PEER_BEGIN);
			break;
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			result.insert(PEER_BEGIN);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::INVALID:
			break;
		}

		switch (wexpr.end) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			result.insert(PEER_END);
			break;
		case WindowBoundary::EXPR_PRECEDING_RANGE:
			result.insert(PEER_END);
			result.insert(VALID_BEGIN);
			break;
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
			result.insert(PEER_END);
			result.insert(VALID_BEGIN);
			result.insert(VALID_END);
			break;
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			result.insert(PEER_END);
			break;
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			result.insert(PEER_END);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::INVALID:
			break;
		}
	}

	if (result.count(VALID_END)) {
		result.insert(PARTITION_END);
		if (HasFollowingRange(wexpr)) {
			result.insert(VALID_BEGIN);
		}
	}
	if (result.count(VALID_BEGIN)) {
		result.insert(PARTITION_BEGIN);
		result.insert(PARTITION_END);
	}
	if (result.count(PEER_END)) {
		result.insert(PARTITION_END);
		if (order_count) {
			result.insert(PEER_BEGIN);
		}
	}
	if (result.count(PARTITION_END) && (partition_count + order_count)) {
		result.insert(PARTITION_BEGIN);
	}

	return result;
}